

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

int despot::Random::GetCategory
              (vector<double,_std::allocator<double>_> *category_probs,double rand_num)

{
  const_reference pvVar1;
  undefined8 local_28;
  double sum;
  int c;
  double rand_num_local;
  vector<double,_std::allocator<double>_> *category_probs_local;
  
  sum._4_4_ = 0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](category_probs,0);
  for (local_28 = *pvVar1; local_28 < rand_num; local_28 = *pvVar1 + local_28) {
    sum._4_4_ = sum._4_4_ + 1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (category_probs,(long)sum._4_4_);
  }
  return sum._4_4_;
}

Assistant:

int Random::GetCategory(const vector<double>& category_probs, double rand_num) {
	int c = 0;
	double sum = category_probs[0];
	while (sum < rand_num) {
		c++;
		sum += category_probs[c];
	}
	return c;
}